

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void destroy_free<boosting>(void *temp)

{
  if (*(void **)((long)temp + 0x60) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x60));
  }
  if (*(void **)((long)temp + 0x48) != (void *)0x0) {
    operator_delete(*(void **)((long)temp + 0x48));
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)((long)temp + 0x30));
  if (*(void **)((long)temp + 8) != (void *)((long)temp + 0x18)) {
    operator_delete(*(void **)((long)temp + 8));
  }
  free(temp);
  return;
}

Assistant:

void destroy_free(void* temp)
{
  ((T*)temp)->~T();
  free(temp);
}